

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManCollectInternal_rec(Gia_Man_t *p,Gia_Obj_t *pGiaObj,Vec_Int_t *vRoAnds)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vRoAnds_local;
  Gia_Obj_t *pGiaObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pGiaObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pGiaObj);
    iVar1 = Gia_ObjIsAnd(pGiaObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pGiaObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                    ,0xe0,"void Gla_ManCollectInternal_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pGiaObj);
    Gla_ManCollectInternal_rec(p,pGVar2,vRoAnds);
    pGVar2 = Gia_ObjFanin1(pGiaObj);
    Gla_ManCollectInternal_rec(p,pGVar2,vRoAnds);
    iVar1 = Gia_ObjId(p,pGiaObj);
    Vec_IntPush(vRoAnds,iVar1);
  }
  return;
}

Assistant:

void Gla_ManCollectInternal_rec( Gia_Man_t * p, Gia_Obj_t * pGiaObj, Vec_Int_t * vRoAnds )
{
    if ( Gia_ObjIsTravIdCurrent(p, pGiaObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pGiaObj);
    assert( Gia_ObjIsAnd(pGiaObj) );
    Gla_ManCollectInternal_rec( p, Gia_ObjFanin0(pGiaObj), vRoAnds );
    Gla_ManCollectInternal_rec( p, Gia_ObjFanin1(pGiaObj), vRoAnds );
    Vec_IntPush( vRoAnds, Gia_ObjId(p, pGiaObj) );
}